

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O2

void printcmd(uint32_t off,uint32_t length)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = (ulong)off;
  printf("0x%08x:",uVar1);
  uVar2 = (ulong)length;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    printf(" %02x",(ulong)bios->data[uVar1]);
    uVar1 = (ulong)((int)uVar1 + 1);
  }
  for (; length < 0x10; length = length + 1) {
    printf("   ");
  }
  return;
}

Assistant:

void printcmd (uint32_t off, uint32_t length) {
	printf ("0x%08x:", off);
	int i;
	for (i = 0; i < length; i++)
		printf(" %02x", bios->data[off+i]);
	for (; i < 16; i++)
		printf ("   ");
}